

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_paeth_predictor_16x8_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [16];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  int iVar13;
  bool bVar14;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar15 [16];
  undefined8 extraout_XMM0_Qb;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  __m128i l16;
  __m128i top0;
  __m128i tl16;
  __m128i top1;
  
  uVar1 = *(ulong *)left;
  auVar15 = *(undefined1 (*) [16])above;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar15._0_13_;
  auVar2[0xe] = auVar15[7];
  auVar3[0xc] = auVar15[6];
  auVar3._0_12_ = auVar15._0_12_;
  auVar3._13_2_ = auVar2._13_2_;
  auVar4[0xb] = 0;
  auVar4._0_11_ = auVar15._0_11_;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5[10] = auVar15[5];
  auVar5._0_10_ = auVar15._0_10_;
  auVar5._11_4_ = auVar4._11_4_;
  auVar6[9] = 0;
  auVar6._0_9_ = auVar15._0_9_;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = auVar15[4];
  auVar7._0_8_ = auVar15._0_8_;
  auVar7._9_6_ = auVar6._9_6_;
  auVar10._7_8_ = 0;
  auVar10._0_7_ = auVar7._8_7_;
  auVar11._1_8_ = SUB158(auVar10 << 0x40,7);
  auVar11[0] = auVar15[3];
  auVar11._9_6_ = 0;
  auVar12._1_10_ = SUB1510(auVar11 << 0x30,5);
  auVar12[0] = auVar15[2];
  auVar12._11_4_ = 0;
  auVar8[2] = auVar15[1];
  auVar8._0_2_ = auVar15._0_2_;
  auVar8._3_12_ = SUB1512(auVar12 << 0x20,3);
  top0[0]._0_2_ = auVar15._0_2_ & 0xff;
  top0._2_13_ = auVar8._2_13_;
  top0[1]._7_1_ = 0;
  top1[0] = (ulong)CONCAT16(auVar15[0xb],
                            (uint6)CONCAT14(auVar15[10],
                                            (uint)CONCAT12(auVar15[9],(ushort)auVar15[8])));
  top1[1]._0_1_ = auVar15[0xc];
  top1[1]._1_1_ = 0;
  top1[1]._2_1_ = auVar15[0xd];
  top1[1]._3_1_ = 0;
  top1[1]._4_1_ = auVar15[0xe];
  top1[1]._5_1_ = 0;
  top1[1]._6_1_ = auVar15[0xf];
  top1[1]._7_1_ = 0;
  auVar15 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  tl16[0]._0_4_ = auVar15._0_4_;
  iVar13 = 8;
  auVar15 = _DAT_0042e4a0;
  tl16[0]._4_4_ = (undefined4)tl16[0];
  tl16[1]._0_4_ = (undefined4)tl16[0];
  tl16[1]._4_4_ = (undefined4)tl16[0];
  while (bVar14 = iVar13 != 0, iVar13 = iVar13 + -1, bVar14) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar1;
    l16 = (__m128i)pshufb(auVar9,auVar15);
    paeth_16x1_pred(&l16,&top0,&top1,&tl16);
    local_88 = auVar15._0_2_;
    sStack_86 = auVar15._2_2_;
    sStack_84 = auVar15._4_2_;
    sStack_82 = auVar15._6_2_;
    sStack_80 = auVar15._8_2_;
    sStack_7e = auVar15._10_2_;
    sStack_7c = auVar15._12_2_;
    sStack_7a = auVar15._14_2_;
    *(undefined8 *)dst = extraout_XMM0_Qa;
    *(undefined8 *)(dst + 8) = extraout_XMM0_Qb;
    dst = dst + stride;
    auVar15._0_2_ = local_88 + 1;
    auVar15._2_2_ = sStack_86 + 1;
    auVar15._4_2_ = sStack_84 + 1;
    auVar15._6_2_ = sStack_82 + 1;
    auVar15._8_2_ = sStack_80 + 1;
    auVar15._10_2_ = sStack_7e + 1;
    auVar15._12_2_ = sStack_7c + 1;
    auVar15._14_2_ = sStack_7a + 1;
  }
  return;
}

Assistant:

void aom_paeth_predictor_16x8_ssse3(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  __m128i l = _mm_loadl_epi64((const __m128i *)left);
  const __m128i t = _mm_load_si128((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top0 = _mm_unpacklo_epi8(t, zero);
  const __m128i top1 = _mm_unpackhi_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);

  int i;
  for (i = 0; i < 8; ++i) {
    const __m128i l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top0, &top1, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}